

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadLayerFromAsset
               (AssetResolutionResolver *resolver,string *resolved_asset_name,Layer *layer,
               string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  Asset *asset_out;
  Asset asset;
  ostringstream ss_e;
  allocator local_259;
  Asset local_258;
  string local_1e0;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  if (resolved_asset_name->_M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"LoadLayerFromAsset");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x554);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Input asset name is empty.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    bVar1 = false;
  }
  else {
    if ((ulong)options->max_allowed_asset_size_in_mb != 0) {
      *(ulong *)(resolver + 0x40) = (ulong)options->max_allowed_asset_size_in_mb;
    }
    local_258.version_._M_dataplus._M_p = (pointer)&local_258.version_.field_2;
    local_258.version_._M_string_length = 0;
    local_258.version_.field_2._M_local_buf[0] = '\0';
    local_258.name_._M_dataplus._M_p = (pointer)&local_258.name_.field_2;
    local_258.name_._M_string_length = 0;
    local_258.name_.field_2._M_local_buf[0] = '\0';
    local_258.resolved_name_._M_dataplus._M_p = (pointer)&local_258.resolved_name_.field_2;
    local_258.resolved_name_._M_string_length = 0;
    local_258.resolved_name_.field_2._M_local_buf[0] = '\0';
    local_258.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_258.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    asset_out = &local_258;
    bVar1 = AssetResolutionResolver::open_asset
                      (resolver,resolved_asset_name,resolved_asset_name,asset_out,warn,err);
    if (bVar1) {
      bVar1 = LoadLayerFromMemory(local_258.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_258.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_258.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  resolved_asset_name,layer,warn,err,options);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadLayerFromAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x55b);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string(local_1c0,"Failed to open asset `{}`.",&local_259);
      fmt::format<std::__cxx11::string>
                (&local_1e0,(fmt *)local_1c0,resolved_asset_name,&asset_out->version_);
      poVar2 = ::std::operator<<((ostream *)local_1a0,(string *)&local_1e0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
      bVar1 = false;
    }
    Asset::~Asset(&local_258);
  }
  return bVar1;
}

Assistant:

bool LoadLayerFromAsset(AssetResolutionResolver &resolver, const std::string &resolved_asset_name, Layer *layer,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {

  if (resolved_asset_name.empty()) {
    PUSH_ERROR_AND_RETURN("Input asset name is empty.");
  }

  resolver.set_max_asset_bytes_in_mb(options.max_allowed_asset_size_in_mb);

  Asset asset;
  if (!resolver.open_asset(resolved_asset_name, resolved_asset_name, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to open asset `{}`.", resolved_asset_name));
  }

  return LoadLayerFromMemory(asset.data(), asset.size(), resolved_asset_name, layer, warn, err,
                           options);
}